

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::optUsage
          (CommandLine<Catch::ConfigData> *this,ostream *os,size_t indent,size_t width)

{
  ulong uVar1;
  ostream *poVar2;
  bool bVar3;
  TextAttributes *this_00;
  unsigned_long *puVar4;
  size_t sVar5;
  string *psVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long in_RCX;
  size_t in_RDX;
  ostream *in_RSI;
  string usageCol;
  size_t i;
  Text desc;
  Text usageText;
  size_t maxWidth;
  const_iterator it;
  const_iterator itEnd;
  const_iterator itBegin;
  string *in_stack_fffffffffffffd68;
  Text *in_stack_fffffffffffffd70;
  allocator local_1e9;
  string local_1e8 [38];
  byte local_1c2;
  allocator local_1c1;
  string local_1c0 [32];
  size_t local_1a0;
  size_t local_198;
  ulong local_190;
  TextAttributes local_188 [4];
  TextAttributes *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  Text *in_stack_ffffffffffffff20;
  Arg *in_stack_ffffffffffffff38;
  string local_68 [32];
  unsigned_long local_48;
  unsigned_long local_40;
  __normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  local_38;
  Arg *local_30;
  Arg *local_28;
  long local_20;
  size_t local_18;
  ostream *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = (Arg *)std::
                    vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                    ::begin((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                             *)in_stack_fffffffffffffd68);
  local_30 = (Arg *)std::
                    vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                    ::end((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
                           *)in_stack_fffffffffffffd68);
  __gnu_cxx::
  __normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
  ::__normal_iterator(&local_38);
  local_40 = 0;
  local_38._M_current = local_28;
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                             *)in_stack_fffffffffffffd70,
                            (__normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                             *)in_stack_fffffffffffffd68), bVar3) {
    __gnu_cxx::
    __normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator->(&local_38);
    Arg::commands_abi_cxx11_(in_stack_ffffffffffffff38);
    local_48 = std::__cxx11::string::size();
    puVar4 = std::max<unsigned_long>(&local_40,&local_48);
    local_40 = *puVar4;
    std::__cxx11::string::~string(local_68);
    __gnu_cxx::
    __normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator++(&local_38);
  }
  local_38._M_current = local_28;
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                             *)in_stack_fffffffffffffd70,
                            (__normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                             *)in_stack_fffffffffffffd68), bVar3) {
    __gnu_cxx::
    __normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator->(&local_38);
    Arg::commands_abi_cxx11_(in_stack_ffffffffffffff38);
    ::Tbc::TextAttributes::TextAttributes((TextAttributes *)&stack0xffffffffffffff00);
    this_00 = ::Tbc::TextAttributes::setWidth
                        ((TextAttributes *)&stack0xffffffffffffff00,local_40 + local_18);
    ::Tbc::TextAttributes::setIndent(this_00,local_18);
    ::Tbc::Text::Text(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10)
    ;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    __gnu_cxx::
    __normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator->(&local_38);
    ::Tbc::TextAttributes::TextAttributes(local_188);
    ::Tbc::TextAttributes::setWidth(local_188,(local_20 - local_40) - 3);
    ::Tbc::Text::Text(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10)
    ;
    local_190 = 0;
    while( true ) {
      uVar7 = local_190;
      local_198 = ::Tbc::Text::size((Text *)0x1af540);
      local_1a0 = ::Tbc::Text::size((Text *)0x1af561);
      puVar4 = std::max<unsigned_long>(&local_198,&local_1a0);
      uVar1 = local_190;
      if (*puVar4 <= uVar7) break;
      local_1c2 = 0;
      sVar5 = ::Tbc::Text::size((Text *)0x1af5bd);
      if (uVar1 < sVar5) {
        psVar6 = ::Tbc::Text::operator[][abi_cxx11_
                           (in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
        std::__cxx11::string::string(local_1c0,(string *)psVar6);
      }
      else {
        std::allocator<char>::allocator();
        local_1c2 = 1;
        std::__cxx11::string::string(local_1c0,"",&local_1c1);
      }
      if ((local_1c2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      }
      std::operator<<(local_10,local_1c0);
      uVar7 = local_190;
      sVar5 = ::Tbc::Text::size((Text *)0x1af686);
      if (uVar7 < sVar5) {
        ::Tbc::Text::operator[][abi_cxx11_
                  (in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
        uVar7 = std::__cxx11::string::empty();
        poVar2 = local_10;
        if ((uVar7 & 1) == 0) {
          lVar8 = local_18 + local_40;
          lVar9 = std::__cxx11::string::size();
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1e8,(lVar8 - lVar9) + 2,' ',&local_1e9);
          in_stack_fffffffffffffd70 = (Text *)std::operator<<(poVar2,local_1e8);
          in_stack_fffffffffffffd68 =
               ::Tbc::Text::operator[][abi_cxx11_
                         (in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
          std::operator<<((ostream *)in_stack_fffffffffffffd70,(string *)in_stack_fffffffffffffd68);
          std::__cxx11::string::~string(local_1e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        }
      }
      std::operator<<(local_10,"\n");
      std::__cxx11::string::~string(local_1c0);
      local_190 = local_190 + 1;
    }
    ::Tbc::Text::~Text(in_stack_fffffffffffffd70);
    ::Tbc::Text::~Text(in_stack_fffffffffffffd70);
    __gnu_cxx::
    __normal_iterator<const_Catch::Clara::CommandLine<Catch::ConfigData>::Arg_*,_std::vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

void optUsage( std::ostream& os, std::size_t indent = 0, std::size_t width = Detail::consoleWidth ) const {
            typename std::vector<Arg>::const_iterator itBegin = m_options.begin(), itEnd = m_options.end(), it;
            std::size_t maxWidth = 0;
            for( it = itBegin; it != itEnd; ++it )
                maxWidth = (std::max)( maxWidth, it->commands().size() );

            for( it = itBegin; it != itEnd; ++it ) {
                Detail::Text usageText( it->commands(), Detail::TextAttributes()
                                                        .setWidth( maxWidth+indent )
                                                        .setIndent( indent ) );
                Detail::Text desc( it->description, Detail::TextAttributes()
                                                        .setWidth( width - maxWidth - 3 ) );

                for( std::size_t i = 0; i < (std::max)( usageText.size(), desc.size() ); ++i ) {
                    std::string usageCol = i < usageText.size() ? usageText[i] : "";
                    os << usageCol;

                    if( i < desc.size() && !desc[i].empty() )
                        os  << std::string( indent + 2 + maxWidth - usageCol.size(), ' ' )
                            << desc[i];
                    os << "\n";
                }
            }
        }